

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckSvgAttr(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  Bool BVar1;
  int iVar2;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_SVG)) {
    prvTidyReportAttrError(doc,node,attval,0x227);
  }
  else {
    BVar1 = IsSvgPaintAttr(attval);
    if (BVar1 != no) {
      if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
        prvTidyReportAttrError(doc,node,attval,0x256);
      }
      else if (((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) ||
              (iVar2 = prvTidytmbstrcasecmp(attval->value,"inherit"), iVar2 != 0)) {
        if ((((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
            (attval->dict->id != TidyAttr_FILL)) &&
           (((attval == (AttVal *)0x0 || (attval->dict == (Attribute *)0x0)) ||
            (attval->dict->id != TidyAttr_STROKE)))) {
          if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
             (attval->dict->id != TidyAttr_FILLRULE)) {
            if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
               (attval->dict->id != TidyAttr_STROKEDASHARRAY)) {
              if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                 (attval->dict->id != TidyAttr_STROKEDASHOFFSET)) {
                if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                   (attval->dict->id != TidyAttr_STROKELINECAP)) {
                  if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                     (attval->dict->id != TidyAttr_STROKELINEJOIN)) {
                    if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                       (attval->dict->id != TidyAttr_STROKEMITERLIMIT)) {
                      if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                         (attval->dict->id != TidyAttr_STROKEWIDTH)) {
                        if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                           (attval->dict->id != TidyAttr_COLORINTERPOLATION)) {
                          if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                             (attval->dict->id != TidyAttr_COLORRENDERING)) {
                            if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0)) ||
                               (attval->dict->id != TidyAttr_OPACITY)) {
                              if (((attval == (AttVal *)0x0) || (attval->dict == (Attribute *)0x0))
                                 || (attval->dict->id != TidyAttr_STROKEOPACITY)) {
                                if (((attval != (AttVal *)0x0) && (attval->dict != (Attribute *)0x0)
                                    ) && (attval->dict->id == TidyAttr_FILLOPACITY)) {
                                  CheckDecimal(doc,node,attval);
                                }
                              }
                              else {
                                CheckDecimal(doc,node,attval);
                              }
                            }
                            else {
                              CheckDecimal(doc,node,attval);
                            }
                          }
                          else {
                            BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values_6);
                            if (BVar1 == no) {
                              prvTidyReportAttrError(doc,node,attval,0x22b);
                            }
                            else {
                              CheckLowerCaseAttrValue(doc,node,attval);
                            }
                          }
                        }
                        else {
                          BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values_5);
                          if (BVar1 == no) {
                            prvTidyReportAttrError(doc,node,attval,0x22b);
                          }
                          else {
                            CheckLowerCaseAttrValue(doc,node,attval);
                          }
                        }
                      }
                      else {
                        CheckLength(doc,node,attval);
                      }
                    }
                    else {
                      CheckNumber(doc,node,attval);
                    }
                  }
                  else {
                    BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values_4);
                    if (BVar1 == no) {
                      prvTidyReportAttrError(doc,node,attval,0x22b);
                    }
                    else {
                      CheckLowerCaseAttrValue(doc,node,attval);
                    }
                  }
                }
                else {
                  BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values_3);
                  if (BVar1 == no) {
                    prvTidyReportAttrError(doc,node,attval,0x22b);
                  }
                  else {
                    CheckLowerCaseAttrValue(doc,node,attval);
                  }
                }
              }
              else {
                CheckLength(doc,node,attval);
              }
            }
            else {
              BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values_2);
              if (BVar1 != no) {
                CheckLowerCaseAttrValue(doc,node,attval);
              }
            }
          }
          else {
            BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values_1);
            if (BVar1 == no) {
              prvTidyReportAttrError(doc,node,attval,0x22b);
            }
            else {
              CheckLowerCaseAttrValue(doc,node,attval);
            }
          }
        }
        else {
          BVar1 = AttrValueIsAmong(attval,CheckSvgAttr::values);
          if (BVar1 == no) {
            CheckColor(doc,node,attval);
          }
          else {
            CheckLowerCaseAttrValue(doc,node,attval);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void CheckSvgAttr( TidyDocImpl* doc, Node *node, AttVal *attval)
{
    if (!nodeIsSVG(node))
    {
        TY_(ReportAttrError)(doc, node, attval, ATTRIBUTE_IS_NOT_ALLOWED);
        return;
    }

    /* Issue #903 - check SVG paint attributes */
    if (IsSvgPaintAttr(attval))
    {
        /* all valid paint attributes have values */
        if (!AttrHasValue(attval))
        {
            TY_(ReportAttrError)(doc, node, attval, MISSING_ATTR_VALUE);
            return;
        }
        /* all paint attributes support an 'inherit' value,
        per https://dev.w3.org/SVG/profiles/1.1F2/publish/painting.html#SpecifyingPaint */
        if (AttrValueIs(attval, "inherit"))
        {
            return;
        }

        /* check paint datatypes
        see https://dev.w3.org/SVG/profiles/1.1F2/publish/painting.html#SpecifyingPaint
        */
        if (attrIsSVG_FILL(attval) || attrIsSVG_STROKE(attval))
        {
            /* TODO: support funciri */
            static ctmbstr const values[] = {
                "none", "currentColor", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                CheckColor(doc, node, attval);
        } 
        else if (attrIsSVG_FILLRULE(attval))
        {
            static ctmbstr const values[] = {"nonzero", "evenodd", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKEDASHARRAY(attval))
        {
            static ctmbstr const values[] = {"none", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
            {
                /* TODO: process dash arrays */
            }
        }
        else if (attrIsSVG_STROKEDASHOFFSET(attval))
        {
            CheckLength(doc, node, attval);
        }
        else if (attrIsSVG_STROKELINECAP(attval))
        {
            static ctmbstr const values[] = {"butt", "round", "square", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKELINEJOIN(attval))
        {
            static ctmbstr const values[] = {"miter", "round", "bevel", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_STROKEMITERLIMIT(attval))
        {
            CheckNumber(doc, node, attval);
        }
        else if (attrIsSVG_STROKEWIDTH(attval))
        {
            CheckLength(doc, node, attval);
        }
        else if (attrIsSVG_COLORINTERPOLATION(attval))
        {
            static ctmbstr const values[] = {"auto", "sRGB", "linearRGB", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if (attrIsSVG_COLORRENDERING(attval))
        {
            static ctmbstr const values[] = {
                "auto", "optimizeSpeed", "optimizeQuality", NULL};

            if (AttrValueIsAmong(attval, values))
                CheckLowerCaseAttrValue(doc, node, attval);
            else
                TY_(ReportAttrError)(doc, node, attval, BAD_ATTRIBUTE_VALUE);
        }
        else if(attrIsSVG_OPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
        else if(attrIsSVG_STROKEOPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
        else if(attrIsSVG_FILLOPACITY(attval))
        {
            CheckDecimal(doc, node, attval);
        }
    }
}